

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall BasicBlock::InsertAfter(BasicBlock *this,Instr *newInstr)

{
  OpCode OVar1;
  BasicBlock *pBVar2;
  Instr *instr;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Func **ppFVar6;
  long lVar7;
  
  pBVar2 = this->next;
  ppFVar6 = (Func **)&pBVar2->firstInstr;
  if (pBVar2 == (BasicBlock *)0x0) {
    ppFVar6 = &this->func;
  }
  lVar7 = 0x18;
  if (pBVar2 == (BasicBlock *)0x0) {
    lVar7 = 0xd0;
  }
  instr = *(Instr **)((long)&(*ppFVar6)->m_alloc + lVar7);
  if (instr->m_kind == InstrKindBranch) {
    OVar1 = instr->m_opcode;
    if (OVar1 < ADD) {
      if ((OVar1 != Br) && (OVar1 != MultiBr)) goto LAB_0041a0b9;
    }
    else {
      bVar4 = LowererMD::IsUnconditionalBranch(instr);
      if (!bVar4) goto LAB_0041a0b9;
    }
  }
  else {
LAB_0041a0b9:
    bVar4 = OpCodeAttr::HasFallThrough(instr->m_opcode);
    if (bVar4) goto LAB_0041a118;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                     ,0xdb2,"(this->GetLastInstr()->HasFallThrough())",
                     "this->GetLastInstr()->HasFallThrough()");
  if (!bVar4) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar5 = 0;
LAB_0041a118:
  pBVar2 = this->next;
  ppFVar6 = (Func **)&pBVar2->firstInstr;
  if (pBVar2 == (BasicBlock *)0x0) {
    ppFVar6 = &this->func;
  }
  lVar7 = 0x18;
  if (pBVar2 == (BasicBlock *)0x0) {
    lVar7 = 0xd0;
  }
  IR::Instr::InsertAfter(*(Instr **)((long)&(*ppFVar6)->m_alloc + lVar7),newInstr);
  return;
}

Assistant:

void
BasicBlock::InsertAfter(IR::Instr *newInstr)
{
    Assert(this->GetLastInstr()->HasFallThrough());
    this->GetLastInstr()->InsertAfter(newInstr);
    this->SetLastInstr(newInstr);
}